

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

long __thiscall mkvparser::Tracks::Parse(Tracks *this)

{
  ulong uVar1;
  long stop;
  long lVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  Track **ppTVar6;
  long lVar7;
  long unaff_R12;
  long unaff_R13;
  ulong uVar8;
  longlong pos;
  longlong size;
  longlong id;
  long local_58;
  Tracks *local_50;
  long local_48;
  long local_40;
  IMkvReader *local_38;
  
  if (this->m_trackEntries != (Track **)0x0) {
    __assert_fail("m_trackEntries == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x162b,"long mkvparser::Tracks::Parse()");
  }
  if (this->m_trackEntriesEnd != (Track **)0x0) {
    __assert_fail("m_trackEntriesEnd == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x162c,"long mkvparser::Tracks::Parse()");
  }
  local_58 = this->m_start;
  stop = this->m_size + local_58;
  local_38 = this->m_pSegment->m_pReader;
  uVar8 = 0;
  local_50 = this;
  if (0 < this->m_size) {
    do {
      lVar5 = ParseElementHeader(local_38,&local_58,stop,&local_40,&local_48);
      bVar4 = true;
      if (-1 < lVar5) {
        if (local_48 == 0) {
          bVar4 = false;
          lVar5 = unaff_R12;
        }
        else {
          if (local_40 == 0xae) {
            uVar1 = uVar8 + 1;
            bVar3 = 0x7ffffffe < (long)uVar8;
            lVar5 = -1;
            uVar8 = uVar1;
            if (bVar3) goto LAB_00125058;
          }
          local_58 = local_48 + local_58;
          bVar4 = stop < local_58;
          lVar5 = unaff_R12;
          if (stop < local_58) {
            lVar5 = -2;
          }
        }
      }
LAB_00125058:
      unaff_R12 = lVar5;
      if (bVar4) {
        return unaff_R12;
      }
      unaff_R13 = unaff_R12;
    } while (local_58 < stop);
  }
  lVar5 = -2;
  if (local_58 == stop) {
    if ((long)uVar8 < 1) {
      lVar5 = 0;
    }
    else {
      ppTVar6 = (Track **)
                operator_new__(-(ulong)(uVar8 >> 0x3d != 0) | uVar8 << 3,(nothrow_t *)&std::nothrow)
      ;
      local_50->m_trackEntries = ppTVar6;
      if (ppTVar6 == (Track **)0x0) {
        lVar5 = -1;
      }
      else {
        local_50->m_trackEntriesEnd = ppTVar6;
        lVar7 = local_50->m_start;
        do {
          if (stop <= lVar7) {
            return (ulong)(lVar7 == stop) * 2 + -2;
          }
          local_58 = lVar7;
          lVar5 = ParseElementHeader(local_38,&local_58,stop,&local_40,&local_48);
          bVar4 = true;
          if (-1 < lVar5) {
            lVar5 = unaff_R13;
            if (local_48 == 0) {
              bVar4 = false;
            }
            else {
              lVar2 = local_58 + local_48;
              if (stop < lVar2) {
                __assert_fail("payload_stop <= stop",
                              "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                              ,0x1668,"long mkvparser::Tracks::Parse()");
              }
              if (local_40 == 0xae) {
                ppTVar6 = local_50->m_trackEntriesEnd;
                *ppTVar6 = (Track *)0x0;
                lVar7 = ParseTrackEntry(local_50,local_58,local_48,lVar7,lVar2 - lVar7,ppTVar6);
                lVar5 = lVar7;
                if ((lVar7 == 0) && (lVar5 = unaff_R13, *ppTVar6 != (Track *)0x0)) {
                  local_50->m_trackEntriesEnd = local_50->m_trackEntriesEnd + 1;
                }
                if (lVar7 != 0) goto LAB_0012517f;
              }
              bVar4 = false;
              local_58 = lVar2;
            }
          }
LAB_0012517f:
          lVar7 = local_58;
          unaff_R13 = lVar5;
        } while (!bVar4);
      }
    }
  }
  return lVar5;
}

Assistant:

long Tracks::Parse() {
  assert(m_trackEntries == NULL);
  assert(m_trackEntriesEnd == NULL);

  const long long stop = m_start + m_size;
  IMkvReader* const pReader = m_pSegment->m_pReader;

  long long count = 0;
  long long pos = m_start;

  while (pos < stop) {
    long long id, size;

    const long status = ParseElementHeader(pReader, pos, stop, id, size);

    if (status < 0)  // error
      return status;

    if (size == 0)  // weird
      continue;

    if (id == libwebm::kMkvTrackEntry) {
      ++count;
      if (count > INT_MAX)
        return E_PARSE_FAILED;
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;

  if (count <= 0)
    return 0;  // success

  m_trackEntries = new (std::nothrow) Track*[static_cast<size_t>(count)];

  if (m_trackEntries == NULL)
    return -1;

  m_trackEntriesEnd = m_trackEntries;

  pos = m_start;

  while (pos < stop) {
    const long long element_start = pos;

    long long id, payload_size;

    const long status =
        ParseElementHeader(pReader, pos, stop, id, payload_size);

    if (status < 0)  // error
      return status;

    if (payload_size == 0)  // weird
      continue;

    const long long payload_stop = pos + payload_size;
    assert(payload_stop <= stop);  // checked in ParseElement

    const long long element_size = payload_stop - element_start;

    if (id == libwebm::kMkvTrackEntry) {
      Track*& pTrack = *m_trackEntriesEnd;
      pTrack = NULL;

      const long status = ParseTrackEntry(pos, payload_size, element_start,
                                          element_size, pTrack);
      if (status)
        return status;

      if (pTrack)
        ++m_trackEntriesEnd;
    }

    pos = payload_stop;
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;

  return 0;  // success
}